

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.h
# Opt level: O3

bool __thiscall Jinx::Impl::Lexer::IsNextDigit(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar2 = this->m_current;
  bVar3 = false;
  if ((*pcVar2 != '\0') && (bVar3 = false, pcVar2 <= this->m_end)) {
    cVar1 = pcVar2[1];
    bVar3 = false;
    if ((-1 < cVar1) && ((cVar1 != '\n' && (cVar1 != '\r')))) {
      bVar3 = (byte)(cVar1 - 0x30U) < 10;
    }
  }
  return bVar3;
}

Assistant:

inline bool IsEndOfText() const { return (!(*m_current) || m_current > m_end) ? true : false; }